

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O0

sunrealtype Hamiltonian(N_Vector yvec,sunrealtype t)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined8 in_RDI;
  sunrealtype sVar4;
  double dVar5;
  sunrealtype sVar6;
  sunrealtype __x;
  double dVar7;
  sunrealtype q;
  sunrealtype p;
  sunrealtype *y;
  sunrealtype H;
  
  pdVar3 = (double *)N_VGetArrayPointer(in_RDI);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  sVar4 = F(5.21892905211963e-318);
  dVar5 = exp(-sVar4);
  sVar4 = omega(5.21927489807172e-318);
  sVar6 = omega(5.21935888923151e-318);
  __x = F(5.21956639680277e-318);
  dVar7 = exp(__x);
  return (dVar1 * dVar1 * dVar5) / 2.0 + (sVar4 * sVar6 * dVar2 * dVar2 * dVar7) / 2.0;
}

Assistant:

sunrealtype Hamiltonian(N_Vector yvec, sunrealtype t)
{
  sunrealtype H       = SUN_RCONST(0.0);
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  const sunrealtype p = y[0];
  const sunrealtype q = y[1];

  H = (p * p * exp(-F(t))) / SUN_RCONST(2.0) +
      (omega(t) * omega(t) * q * q * exp(F(t))) / SUN_RCONST(2.0);

  return H;
}